

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Train.cpp
# Opt level: O0

float trainIterate(vector<layer_t_*,_std::allocator<layer_t_*>_> *layers,
                  tensor_t<float> *train_tensor,tensor_t<float> *expected_output)

{
  size_type sVar1;
  bool bVar2;
  tensor_t<float> *this;
  tensor_t<float> *ptVar3;
  reference pplVar4;
  size_type sVar5;
  reference pvVar6;
  vector<float,_std::allocator<float>_> *in_RDX;
  vector<layer_t_*,_std::allocator<layer_t_*>_> *in_RDI;
  vector<float,_std::allocator<float>_> *this_00;
  value_type vVar7;
  float f;
  int i_2;
  float err;
  layer_t **layer;
  iterator __end1;
  iterator __begin1;
  vector<layer_t_*,_std::allocator<layer_t_*>_> *__range1;
  ssize_t i_1;
  tensor_t<float> grads;
  int i;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  value_type in_stack_ffffffffffffff50;
  value_type in_stack_ffffffffffffff60;
  int local_88;
  float local_84;
  __normal_iterator<layer_t_**,_std::vector<layer_t_*,_std::allocator<layer_t_*>_>_> local_70;
  vector<layer_t_*,_std::allocator<layer_t_*>_> *local_68;
  size_type local_50;
  vector<float,_std::allocator<float>_> local_48;
  int local_30;
  int local_2c;
  int local_28;
  int local_1c;
  vector<float,_std::allocator<float>_> *local_18;
  vector<layer_t_*,_std::allocator<layer_t_*>_> *local_8;
  
  local_1c = 0;
  local_18 = in_RDX;
  local_8 = in_RDI;
  while( true ) {
    this = (tensor_t<float> *)(long)local_1c;
    ptVar3 = (tensor_t<float> *)std::vector<layer_t_*,_std::allocator<layer_t_*>_>::size(local_8);
    if (ptVar3 <= this) break;
    if (local_1c == 0) {
      std::vector<layer_t_*,_std::allocator<layer_t_*>_>::operator[](local_8,0);
      activate(in_stack_ffffffffffffff50,
               (tensor_t<float> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    else {
      pplVar4 = std::vector<layer_t_*,_std::allocator<layer_t_*>_>::operator[]
                          (local_8,(long)local_1c);
      in_stack_ffffffffffffff60 = *pplVar4;
      std::vector<layer_t_*,_std::allocator<layer_t_*>_>::operator[](local_8,(long)(local_1c + -1));
      activate(in_stack_ffffffffffffff50,
               (tensor_t<float> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    local_1c = local_1c + 1;
  }
  std::vector<layer_t_*,_std::allocator<layer_t_*>_>::back
            ((vector<layer_t_*,_std::allocator<layer_t_*>_> *)in_stack_ffffffffffffff50);
  tensor_t<float>::operator-(this,(tensor_t<float> *)in_stack_ffffffffffffff60);
  local_50 = std::vector<layer_t_*,_std::allocator<layer_t_*>_>::size(local_8);
  while (local_50 = local_50 - 1, sVar1 = local_50, -1 < (long)local_50) {
    sVar5 = std::vector<layer_t_*,_std::allocator<layer_t_*>_>::size(local_8);
    if (sVar1 == sVar5 - 1) {
      std::vector<layer_t_*,_std::allocator<layer_t_*>_>::operator[](local_8,local_50);
      calc_grads(in_stack_ffffffffffffff50,
                 (tensor_t<float> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    else {
      pplVar4 = std::vector<layer_t_*,_std::allocator<layer_t_*>_>::operator[](local_8,local_50);
      in_stack_ffffffffffffff50 = *pplVar4;
      std::vector<layer_t_*,_std::allocator<layer_t_*>_>::operator[](local_8,local_50 + 1);
      calc_grads(in_stack_ffffffffffffff50,
                 (tensor_t<float> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
  }
  local_68 = local_8;
  local_70._M_current =
       (layer_t **)
       std::vector<layer_t_*,_std::allocator<layer_t_*>_>::begin
                 ((vector<layer_t_*,_std::allocator<layer_t_*>_> *)
                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  std::vector<layer_t_*,_std::allocator<layer_t_*>_>::end
            ((vector<layer_t_*,_std::allocator<layer_t_*>_> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<layer_t_**,_std::vector<layer_t_*,_std::allocator<layer_t_*>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<layer_t_**,_std::vector<layer_t_*,_std::allocator<layer_t_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)), bVar2
        ) {
    __gnu_cxx::__normal_iterator<layer_t_**,_std::vector<layer_t_*,_std::allocator<layer_t_*>_>_>::
    operator*(&local_70);
    fix_weights(in_stack_ffffffffffffff50);
    __gnu_cxx::__normal_iterator<layer_t_**,_std::vector<layer_t_*,_std::allocator<layer_t_*>_>_>::
    operator++(&local_70);
  }
  local_84 = 0.0;
  for (local_88 = 0; local_88 < local_30 * local_2c * local_28; local_88 = local_88 + 1) {
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](local_18,(long)local_88);
    if (0.5 < *pvVar6) {
      this_00 = &local_48;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](this_00,(long)local_88);
      vVar7 = *pvVar6;
      std::abs((int)this_00);
      local_84 = vVar7 + local_84;
    }
  }
  local_84 = local_84 * 100.0;
  tensor_t<float>::~tensor_t((tensor_t<float> *)0x10a4a1);
  return local_84;
}

Assistant:

float trainIterate(std::vector<layer_t *> &layers, tensor_t<float> &train_tensor, tensor_t<float> &expected_output) {
  // Activate each layer with the training tensor as input
  for (int i = 0; i < layers.size(); i++) {
    if (i == 0)
      activate(layers[i], train_tensor);
    else
      activate(layers[i], layers[i - 1]->out);
  }

  // Check the difference with the label / expected output
  tensor_t<float> grads = layers.back()->out - expected_output;

  // Calculate the gradients
  for (ssize_t i = layers.size() - 1; i >= 0; i--) {
    if (i == layers.size() - 1)
      calc_grads(layers[i], grads);
    else
      calc_grads(layers[i], layers[i + 1]->grads_in);
  }

  // Potentially update the weights
  for (auto &layer : layers) {
    fix_weights(layer);
  }

  // Calculate the error
  float err = 0;
  for (int i = 0; i < grads.size.x * grads.size.y * grads.size.z; i++) {
    float f = expected_output.data[i];
    if (f > 0.5)
      err += abs(grads.data[i]);
  }
  return err * 100;
}